

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O2

void cdef_filter_block_internal
               (uint8_t *dst8,uint16_t *dst16,int dstride,uint16_t *in,int pri_strength,
               int sec_strength,int dir,int pri_damping,int sec_damping,int coeff_shift,
               int block_width,int block_height,int enable_primary,int enable_secondary)

{
  long lVar1;
  uint16_t *puVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint16_t uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  bool bVar21;
  bool bVar22;
  int local_cc;
  
  bVar21 = enable_primary != 0;
  bVar22 = enable_secondary != 0;
  if (block_width < 1) {
    block_width = 0;
  }
  lVar1 = (long)dir * 8;
  uVar11 = 0;
  uVar12 = (ulong)(uint)block_height;
  if (block_height < 1) {
    uVar12 = uVar11;
  }
  do {
    if (uVar11 == uVar12) {
      return;
    }
    for (uVar14 = 0; uVar14 != (uint)block_width; uVar14 = uVar14 + 1) {
      lVar13 = uVar14 + uVar11 * 0x90;
      puVar2 = in + lVar13;
      uVar15 = *puVar2;
      iVar5 = (int)(short)uVar15;
      iVar8 = 0;
      iVar18 = iVar5;
      local_cc = iVar5;
      for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
        if (enable_primary == 0) {
LAB_0032f858:
          if (enable_secondary != 0) goto LAB_0032f866;
        }
        else {
          lVar10 = (long)*(int *)(lVar1 + 0x47b450 + lVar19 * 4);
          uVar3 = puVar2[lVar10];
          iVar17 = (int)(short)uVar3;
          uVar4 = in[lVar13 - lVar10];
          iVar20 = (int)(short)uVar4;
          iVar16 = cdef_pri_taps[((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0][lVar19];
          iVar6 = constrain(iVar17 - iVar5,pri_strength,pri_damping);
          iVar7 = constrain(iVar20 - iVar5,pri_strength,pri_damping);
          iVar8 = iVar7 * iVar16 + iVar8 + iVar6 * iVar16;
          if (!bVar22 || !bVar21) goto LAB_0032f858;
          iVar16 = local_cc;
          if (local_cc <= iVar17) {
            iVar16 = iVar17;
          }
          if (uVar3 == 0x4000) {
            iVar16 = local_cc;
          }
          local_cc = iVar16;
          if (iVar16 <= iVar20) {
            local_cc = iVar20;
          }
          if (uVar4 == 0x4000) {
            local_cc = iVar16;
          }
          if (iVar17 <= iVar18) {
            iVar18 = iVar17;
          }
          if (iVar20 <= iVar18) {
            iVar18 = iVar20;
          }
LAB_0032f866:
          lVar10 = (long)*(int *)(lVar1 + 0x47b460 + lVar19 * 4);
          iVar7 = (int)(short)puVar2[lVar10];
          iVar17 = (int)(short)in[lVar13 - lVar10];
          iVar16 = (int)(short)puVar2[cdef_directions_padded[dir][lVar19]];
          iVar6 = (int)(short)in[lVar13 - cdef_directions_padded[dir][lVar19]];
          if (bVar22 && bVar21) {
            iVar20 = local_cc;
            if (local_cc <= iVar7) {
              iVar20 = iVar7;
            }
            if (puVar2[lVar10] == 0x4000) {
              iVar20 = local_cc;
            }
            iVar9 = iVar20;
            if (iVar20 <= iVar17) {
              iVar9 = iVar17;
            }
            if (in[lVar13 - lVar10] == 0x4000) {
              iVar9 = iVar20;
            }
            iVar20 = iVar9;
            if (iVar9 <= iVar16) {
              iVar20 = iVar16;
            }
            if (puVar2[cdef_directions_padded[dir][lVar19]] == 0x4000) {
              iVar20 = iVar9;
            }
            local_cc = iVar20;
            if (iVar20 <= iVar6) {
              local_cc = iVar6;
            }
            if (in[lVar13 - cdef_directions_padded[dir][lVar19]] == 0x4000) {
              local_cc = iVar20;
            }
            if (iVar7 <= iVar18) {
              iVar18 = iVar7;
            }
            if (iVar17 <= iVar18) {
              iVar18 = iVar17;
            }
            if (iVar16 <= iVar18) {
              iVar18 = iVar16;
            }
            if (iVar6 <= iVar18) {
              iVar18 = iVar6;
            }
          }
          iVar20 = cdef_sec_taps[lVar19];
          iVar7 = constrain(iVar7 - iVar5,sec_strength,sec_damping);
          iVar17 = constrain(iVar17 - iVar5,sec_strength,sec_damping);
          iVar16 = constrain(iVar16 - iVar5,sec_strength,sec_damping);
          iVar6 = constrain(iVar6 - iVar5,sec_strength,sec_damping);
          iVar8 = iVar6 * iVar20 + iVar16 * iVar20 + iVar17 * iVar20 + iVar8 + iVar7 * iVar20;
        }
      }
      uVar15 = uVar15 + (short)((int)(short)iVar8 + ((int)(short)iVar8 >> 0xf) + 8U >> 4);
      if (bVar22 && bVar21) {
        iVar5 = (int)(short)uVar15;
        if (iVar5 < local_cc) {
          local_cc = iVar5;
        }
        if (iVar5 < iVar18) {
          local_cc = iVar18;
        }
        uVar15 = (uint16_t)local_cc;
      }
      if (dst8 == (uint8_t *)0x0) {
        dst16[uVar11 * (long)dstride + uVar14] = uVar15;
      }
      else {
        dst8[uVar14 + uVar11 * (long)dstride] = (uint8_t)uVar15;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

static void cdef_filter_block_internal(
    uint8_t *dst8, uint16_t *dst16, int dstride, const uint16_t *in,
    int pri_strength, int sec_strength, int dir, int pri_damping,
    int sec_damping, int coeff_shift, int block_width, int block_height,
    int enable_primary, int enable_secondary) {
  const int clipping_required = (enable_primary && enable_secondary);
  int i, j, k;
  const int s = CDEF_BSTRIDE;
  const int *pri_taps = cdef_pri_taps[(pri_strength >> coeff_shift) & 1];
  const int *sec_taps = cdef_sec_taps;
  for (i = 0; i < block_height; i++) {
    for (j = 0; j < block_width; j++) {
      int16_t sum = 0;
      int16_t y;
      int16_t x = in[i * s + j];
      int max = x;
      int min = x;
      for (k = 0; k < 2; k++) {
        if (enable_primary) {
          int16_t p0 = in[i * s + j + cdef_directions[dir][k]];
          int16_t p1 = in[i * s + j - cdef_directions[dir][k]];
          sum += pri_taps[k] * constrain(p0 - x, pri_strength, pri_damping);
          sum += pri_taps[k] * constrain(p1 - x, pri_strength, pri_damping);
          if (clipping_required) {
            if (p0 != CDEF_VERY_LARGE) max = AOMMAX(p0, max);
            if (p1 != CDEF_VERY_LARGE) max = AOMMAX(p1, max);
            min = AOMMIN(p0, min);
            min = AOMMIN(p1, min);
          }
        }
        if (enable_secondary) {
          int16_t s0 = in[i * s + j + cdef_directions[dir + 2][k]];
          int16_t s1 = in[i * s + j - cdef_directions[dir + 2][k]];
          int16_t s2 = in[i * s + j + cdef_directions[dir - 2][k]];
          int16_t s3 = in[i * s + j - cdef_directions[dir - 2][k]];
          if (clipping_required) {
            if (s0 != CDEF_VERY_LARGE) max = AOMMAX(s0, max);
            if (s1 != CDEF_VERY_LARGE) max = AOMMAX(s1, max);
            if (s2 != CDEF_VERY_LARGE) max = AOMMAX(s2, max);
            if (s3 != CDEF_VERY_LARGE) max = AOMMAX(s3, max);
            min = AOMMIN(s0, min);
            min = AOMMIN(s1, min);
            min = AOMMIN(s2, min);
            min = AOMMIN(s3, min);
          }
          sum += sec_taps[k] * constrain(s0 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s1 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s2 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s3 - x, sec_strength, sec_damping);
        }
      }
      y = ((int16_t)x + ((8 + sum - (sum < 0)) >> 4));
      if (clipping_required) {
        y = clamp(y, min, max);
      }

      if (dst8)
        dst8[i * dstride + j] = (uint8_t)y;
      else
        dst16[i * dstride + j] = (uint16_t)y;
    }
  }
}